

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PedestriansWalkingAnEight.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_70a26::PedestrianPlugIn::~PedestrianPlugIn(PedestrianPlugIn *this)

{
  PedestrianPlugIn *in_RDI;
  
  ~PedestrianPlugIn(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

virtual ~PedestrianPlugIn() {}